

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  _Map_pointer *this;
  pointer ppNVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 extraout_RAX;
  pointer ppNVar4;
  int iVar5;
  initializer_list<int> __l;
  _Deque_base<Node_*,_std::allocator<Node_*>_> local_258;
  _Deque_base<Node_*,_std::allocator<Node_*>_> local_208;
  undefined1 local_1b8 [8];
  Node init;
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> closedList;
  undefined1 local_118 [8];
  vector<int,_std::allocator<int>_> goalState;
  undefined1 auStack_e8 [8];
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> openList;
  undefined1 auStack_88 [8];
  vector<Node_*,_std::allocator<Node_*>_> solution;
  undefined1 auStack_68 [8];
  vector<int,_std::allocator<int>_> initial;
  Node *local_48;
  Node *currentChild;
  Node *currentNode;
  
  initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  auStack_e8._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)auStack_e8);
  auStack_e8._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)auStack_e8);
  auStack_e8._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)auStack_e8);
  auStack_e8._0_4_ = 4;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)auStack_e8);
  auStack_e8._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)auStack_e8);
  auStack_e8._0_4_ = 5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)auStack_e8);
  auStack_e8._0_4_ = 6;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)auStack_e8);
  auStack_e8._0_4_ = 7;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)auStack_e8);
  auStack_e8._0_4_ = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_68,(int *)auStack_e8);
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0x600000005;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x800000007;
  auStack_e8 = (undefined1  [8])0x200000001;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x400000003;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first._0_4_ = 0;
  __l._M_len = 9;
  __l._M_array = (iterator)auStack_e8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_118,__l,(allocator_type *)&init.parent);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)auStack_68);
  Node::Node((Node *)local_1b8,
             (vector<int,_std::allocator<int>_> *)
             &goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Node *)0x0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::queue<Node*,std::deque<Node*,std::allocator<Node*>>>::
  queue<std::deque<Node*,std::allocator<Node*>>,void>
            ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)auStack_e8);
  std::queue<Node*,std::deque<Node*,std::allocator<Node*>>>::
  queue<std::deque<Node*,std::allocator<Node*>>,void>
            ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)&init.parent);
  auStack_88 = (undefined1  [8])local_1b8;
  std::deque<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((deque<Node_*,_std::allocator<Node_*>_> *)auStack_e8,(Node **)auStack_88);
  auStack_88 = (undefined1  [8])0x0;
  solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Searching for solution...");
  std::endl<char,std::char_traits<char>>(poVar3);
  currentNode._4_4_ = 0;
  this = &closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_node;
  iVar5 = 0;
  while ((openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node !=
          (_Map_pointer)
          openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Deque_impl_data._M_map_size && ((currentNode._4_4_ & 1) == 0))) {
    currentChild = *(Node **)openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                             super__Deque_impl_data._M_map_size;
    std::deque<Node_*,_std::allocator<Node_*>_>::push_back
              ((deque<Node_*,_std::allocator<Node_*>_> *)&init.parent,&currentChild);
    std::deque<Node_*,_std::allocator<Node_*>_>::pop_front
              ((deque<Node_*,_std::allocator<Node_*>_> *)auStack_e8);
    Node::moveUp(currentChild);
    Node::moveDown(currentChild);
    Node::moveRight(currentChild);
    Node::moveLeft(currentChild);
    ppNVar4 = (currentChild->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar1 = (currentChild->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    currentNode._4_4_ = 0;
    solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = iVar5;
    while( true ) {
      if (ppNVar4 == ppNVar1) break;
      local_48 = *ppNVar4;
      openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node = (_Map_pointer)ppNVar4;
      bVar2 = std::operator==(&local_48->puzzle,(vector<int,_std::allocator<int>_> *)local_118);
      if (bVar2) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Goal Found.");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::vector<Node_*,_std::allocator<Node_*>_>::vector
                  ((vector<Node_*,_std::allocator<Node_*>_> *)this,
                   (vector<Node_*,_std::allocator<Node_*>_> *)auStack_88);
        traceSolution((vector<Node_*,_std::allocator<Node_*>_> *)this,local_48);
        std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
                  ((_Vector_base<Node_*,_std::allocator<Node_*>_> *)this);
        currentNode._4_4_ = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      std::deque<Node_*,_std::allocator<Node_*>_>::deque
                ((deque<Node_*,_std::allocator<Node_*>_> *)&local_258,
                 (deque<Node_*,_std::allocator<Node_*>_> *)auStack_e8);
      bVar2 = contains((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)&local_258,
                       local_48);
      if (bVar2) {
        std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base(&local_258);
      }
      else {
        std::deque<Node_*,_std::allocator<Node_*>_>::deque
                  ((deque<Node_*,_std::allocator<Node_*>_> *)&local_208,
                   (deque<Node_*,_std::allocator<Node_*>_> *)&init.parent);
        bVar2 = contains((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)&local_208,
                         local_48);
        std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base(&local_208);
        std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base(&local_258);
        if (!bVar2) {
          std::deque<Node_*,_std::allocator<Node_*>_>::push_back
                    ((deque<Node_*,_std::allocator<Node_*>_> *)auStack_e8,&local_48);
        }
      }
      ppNVar4 = (pointer)(openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node + 1);
    }
    iVar5 = solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"No. of nodes in closed list: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            ((_Vector_base<Node_*,_std::allocator<Node_*>_> *)auStack_88);
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base
            ((_Deque_base<Node_*,_std::allocator<Node_*>_> *)&init.parent);
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base
            ((_Deque_base<Node_*,_std::allocator<Node_*>_> *)auStack_e8);
  Node::~Node((Node *)local_1b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_118);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)auStack_68);
  return 0;
}

Assistant:

int main() {
  std::vector<int> initial;
  initial.push_back(1);
  initial.push_back(2);
  initial.push_back(3);
  initial.push_back(4);
  initial.push_back(0);
  initial.push_back(5);
  initial.push_back(6);
  initial.push_back(7);
  initial.push_back(8);
  vector<int> goalState = { 1, 2, 3, 4, 5, 6, 7, 8, 0 };
  Node init = Node(initial, NULL);
  std::queue<Node*> openList;
  std::queue<Node*> closedList;
  openList.push(&init);
  bool goalFound = false;
  int count = 0;
  vector<Node*> solution;
  cout << "Searching for solution..." << endl;
  while (!openList.empty() && !goalFound) {
    Node* currentNode = openList.front();
    closedList.push(currentNode);
    openList.pop();
    currentNode->moveUp();
    currentNode->moveDown();
    currentNode->moveRight();
    currentNode->moveLeft();

    for (auto i : currentNode->children) {
      Node* currentChild = i;
      if (currentChild->puzzle == goalState) {
        std::cout << "Goal Found." << endl;
        traceSolution(solution, currentChild);
        goalFound = true;

      }
      if (!contains(openList, currentChild)
          && !contains(closedList, currentChild)) {
        openList.push(currentChild);
      }

    }
    count++;
  }
  cout << "No. of nodes in closed list: " << count << endl;
//  printToFile(closedList);  // uncomment this line to print node in text file
}